

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

void array_negation_test(void)

{
  array_container_t *a;
  bitset_container_t *bitset;
  int x_1;
  int x;
  bitset_container_t *BO;
  array_container_t *AI;
  int ctr;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  uint16_t in_stack_ffffffffffffffde;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  int iVar2;
  
  a = array_container_create();
  bitset = bitset_container_create();
  for (iVar2 = 0; iVar2 < 0x10000; iVar2 = iVar2 + 0x1d) {
    array_container_add((array_container_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffde);
  }
  array_container_negation
            ((array_container_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
             (bitset_container_t *)
             CONCAT26(in_stack_ffffffffffffffde,
                      CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)));
  bitset_container_cardinality(bitset);
  _assert_int_equal((unsigned_long)a,(unsigned_long)bitset,
                    (char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                    CONCAT22(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc));
  for (iVar1 = 0; iVar1 < 0x10000; iVar1 = iVar1 + 1) {
    if (iVar1 % 0x1d == 0) {
      bitset_container_contains
                ((bitset_container_t *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffde);
      _assert_true((unsigned_long)a,(char *)bitset,(char *)CONCAT44(iVar2,iVar1),
                   CONCAT22(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc));
    }
    else {
      bitset_container_contains
                ((bitset_container_t *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffde);
      _assert_true((unsigned_long)a,(char *)bitset,(char *)CONCAT44(iVar2,iVar1),
                   CONCAT22(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc));
    }
    array_container_add((array_container_t *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffde);
  }
  array_container_free((array_container_t *)0x108826);
  bitset_container_free((bitset_container_t *)0x108830);
  return;
}

Assistant:

DEFINE_TEST(array_negation_test) {
    int ctr = 0;
    array_container_t* AI = array_container_create();
    bitset_container_t* BO = bitset_container_create();

    for (int x = 0; x < (1 << 16); x += 29) {
        array_container_add(AI, (uint16_t)x);
        ++ctr;
    }

    array_container_negation(AI, BO);
    assert_int_equal(bitset_container_cardinality(BO), (1 << 16) - ctr);

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 29 == 0) {
            assert_false(bitset_container_contains(BO, (uint16_t)x));
        } else {
            assert_true(bitset_container_contains(BO, (uint16_t)x));
        }
        array_container_add(AI, (uint16_t)x);
        ++ctr;
    }

    array_container_free(AI);
    bitset_container_free(BO);
}